

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Flow(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int nAnds;
  int nLevels;
  char *pcVar2;
  uint local_40;
  int fVerbose;
  int c;
  int fUseMfs;
  int fMinAve;
  int nCutNum;
  int nLutSize;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fMinAve = 6;
  fUseMfs = 8;
  c = 0;
  fVerbose = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
LAB_002adfcd:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"KCtmvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Flow(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManHasMapping(pAbc->pGia);
      nAnds = Gia_ManAndNum(pAbc->pGia);
      nLevels = Gia_ManLevelNum(pAbc->pGia);
      Gia_ManPerformFlow(iVar1,nAnds,nLevels,fMinAve,fUseMfs,c,fVerbose,local_40);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002ae1a2;
      }
      fUseMfs = atoi(argv[globalUtilOptind]);
      iVar1 = fUseMfs;
      break;
    default:
      goto LAB_002ae1a2;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_002ae1a2;
      }
      fMinAve = atoi(argv[globalUtilOptind]);
      iVar1 = fMinAve;
      break;
    case 0x68:
      goto LAB_002ae1a2;
    case 0x6d:
      fVerbose = fVerbose ^ 1;
      goto LAB_002adfcd;
    case 0x74:
      c = c ^ 1;
      goto LAB_002adfcd;
    case 0x76:
      local_40 = local_40 ^ 1;
      goto LAB_002adfcd;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002ae1a2:
      Abc_Print(-2,"usage: &flow [-KC num] [-tmvh]\n");
      Abc_Print(-2,"\t         integration optimization and mapping flow\n");
      Abc_Print(-2,"\t-K num : the number of LUT inputs (LUT size) [default = %d]\n",
                (ulong)(uint)fMinAve);
      Abc_Print(-2,"\t-C num : the number of cuts at a node [default = %d]\n",(ulong)(uint)fUseMfs);
      pcVar2 = "no";
      if (c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle minimizing average rather than max delay [default = %s]\n",
                pcVar2);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggle using \"mfs2\" in the script [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_40 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Flow( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManPerformFlow( int fIsMapped, int nAnds, int nLevels, int nLutSize, int nCutNum, int fMinAve, int fUseMfs, int fVerbose );
    int nLutSize    =  6;
    int nCutNum     =  8;
    int fMinAve     =  0;
    int fUseMfs     =  0;
    int c, fVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCtmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
         case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 't':
            fMinAve ^= 1;
            break;
        case 'm':
            fUseMfs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Flow(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManPerformFlow( Gia_ManHasMapping(pAbc->pGia), Gia_ManAndNum(pAbc->pGia), Gia_ManLevelNum(pAbc->pGia), nLutSize, nCutNum, fMinAve, fUseMfs, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &flow [-KC num] [-tmvh]\n" );
    Abc_Print( -2, "\t         integration optimization and mapping flow\n" );
    Abc_Print( -2, "\t-K num : the number of LUT inputs (LUT size) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-C num : the number of cuts at a node [default = %d]\n", nCutNum );
    Abc_Print( -2, "\t-t     : toggle minimizing average rather than max delay [default = %s]\n", fMinAve? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using \"mfs2\" in the script [default = %s]\n", fUseMfs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}